

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_test.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  bool bVar2;
  Example clone_universe;
  Example universe;
  Example local_130;
  Example local_a8;
  
  sch::CD_Scene::CD_Scene(&local_a8.sObj);
  local_a8.CurrentObj = 0;
  local_a8.objName.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.objName.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.objName.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Example::initializeUniverse(&local_a8);
  bVar1 = Example::unittest(&local_a8);
  sch::CD_Scene::CD_Scene(&local_130.sObj);
  local_130.CurrentObj = 0;
  local_130.objName.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_130.objName.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130.objName.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CloneUniverse(&local_a8,&local_130);
  bVar2 = Example::unittest(&local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_130.objName);
  sch::CD_Scene::~CD_Scene(&local_130.sObj);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.objName);
  sch::CD_Scene::~CD_Scene(&local_a8.sObj);
  return (uint)(!bVar1 || !bVar2);
}

Assistant:

int main()
{
#ifdef ENABLE_SIGFPE
  feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT);
#endif
  Example universe;
  universe.initializeUniverse();
  bool success = universe.unittest();
  {
    Example clone_universe;
    CloneUniverse(universe, clone_universe);
    success = clone_universe.unittest() && success;
  }
  return (success ? 0 : 1);
}